

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.c
# Opt level: O3

int32 mmi_viterbi_run(float64 *log_forw_prob,vector_t **feature,uint32 n_obs,state_t *state_seq,
                     uint32 n_state,model_inventory_t *inv,float64 a_beam)

{
  uint uVar1;
  double dVar2;
  float64 *scale;
  float64 **dscale;
  uint32 *n_active_astate;
  float64 **active_alpha;
  uint32 **active_astate;
  void *ptr;
  uint32 **bp;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  ulong n_elem;
  uint uVar6;
  char cVar7;
  ulong uVar8;
  double dVar9;
  int32 local_80;
  
  if (n_obs == 0) {
    __assert_fail("n_obs > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                  ,0x2d1,
                  "int32 mmi_viterbi_run(float64 *, vector_t **, uint32, state_t *, uint32, model_inventory_t *, float64)"
                 );
  }
  if (n_state == 0) {
    __assert_fail("n_state > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                  ,0x2d2,
                  "int32 mmi_viterbi_run(float64 *, vector_t **, uint32, state_t *, uint32, model_inventory_t *, float64)"
                 );
  }
  n_elem = (ulong)n_obs;
  scale = (float64 *)
          __ckd_calloc__(n_elem,8,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                         ,0x2d4);
  dscale = (float64 **)
           __ckd_calloc__(n_elem,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                          ,0x2d5);
  n_active_astate =
       (uint32 *)
       __ckd_calloc__(n_elem,4,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                      ,0x2d6);
  active_alpha = (float64 **)
                 __ckd_calloc__(n_elem,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                                ,0x2d7);
  active_astate =
       (uint32 **)
       __ckd_calloc__(n_elem,8,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                      ,0x2d8);
  ptr = __ckd_calloc__((ulong)(n_state * 2),4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                       ,0x2d9);
  bp = (uint32 **)
       __ckd_calloc__(n_elem,8,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                      ,0x2da);
  local_80 = forward(active_alpha,active_astate,n_active_astate,bp,scale,dscale,feature,n_obs,
                     state_seq,n_state,inv,a_beam,(s3phseg_t *)0x0,(bw_timers_t *)0x0,1);
  uVar8 = 0;
  if (local_80 == 0) {
    uVar6 = n_obs - 1;
    uVar1 = n_active_astate[uVar6];
    if ((ulong)uVar1 == 0) {
LAB_0010e02f:
      if ((uint)uVar8 != uVar1) {
        if ((double)active_alpha[uVar6][uVar8 & 0xffffffff] <= 0.0) {
          __assert_fail("active_alpha[n_obs-1][i] > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                        ,0x2f9,
                        "int32 mmi_viterbi_run(float64 *, vector_t **, uint32, state_t *, uint32, model_inventory_t *, float64)"
                       );
        }
        dVar9 = log((double)active_alpha[uVar6][uVar8 & 0xffffffff]);
        uVar8 = 0;
        do {
          if ((double)scale[uVar8] <= 0.0) {
            __assert_fail("scale[t] > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                          ,0x2fc,
                          "int32 mmi_viterbi_run(float64 *, vector_t **, uint32, state_t *, uint32, model_inventory_t *, float64)"
                         );
          }
          dVar2 = log((double)scale[uVar8]);
          dVar9 = dVar9 - dVar2;
          uVar4 = (ulong)inv->gauden->n_feat;
          if (uVar4 != 0) {
            uVar5 = 0;
            do {
              dVar9 = dVar9 + (double)dscale[uVar8][uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar4 != uVar5);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != n_elem);
        *log_forw_prob = (float64)dVar9;
        local_80 = 0;
        cVar7 = '\0';
        goto LAB_0010e048;
      }
    }
    else {
      uVar8 = 0;
      do {
        if (active_astate[uVar6][uVar8] == n_state - 1) goto LAB_0010e02f;
        uVar8 = uVar8 + 1;
      } while (uVar1 != uVar8);
    }
    uVar8 = 1;
    local_80 = -1;
  }
  cVar7 = (char)uVar8;
LAB_0010e048:
  ckd_free(scale);
  uVar8 = 0;
  do {
    if (dscale[uVar8] != (float64 *)0x0) {
      ckd_free(dscale[uVar8]);
    }
    uVar8 = uVar8 + 1;
  } while (n_elem != uVar8);
  ckd_free(dscale);
  ckd_free(n_active_astate);
  uVar8 = 0;
  do {
    ckd_free(active_alpha[uVar8]);
    ckd_free(active_astate[uVar8]);
    ckd_free(bp[uVar8]);
    uVar8 = uVar8 + 1;
  } while (n_elem != uVar8);
  ckd_free(active_alpha);
  ckd_free(active_astate);
  ckd_free(ptr);
  ckd_free(bp);
  if (local_80 != 0 && cVar7 == '\0') {
    pcVar3 = corpus_utt_brief_name();
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
            ,0x318,"viterbi run error in sentence %s\n",pcVar3);
  }
  return local_80;
}

Assistant:

int32
mmi_viterbi_run(float64 *log_forw_prob,
		vector_t **feature,
		uint32 n_obs,
		state_t *state_seq,
		uint32 n_state,
		model_inventory_t *inv,
		float64 a_beam)
{
    float64 *scale = NULL;
    float64 **dscale = NULL;
    float64 **active_alpha;
    uint32 **active_astate;
    uint32 **bp;
    uint32 *n_active_astate;
    uint32 *active_cb;
    uint32 i, j;
    int32 t;
    int ret;
    int final_state_error = 0;
    float64 log_fp;/* accumulator for the log of the probability
		    * of observing the input given the model */
    
    /* caller must ensure that there is some non-zero amount
       of work to be done here */
    assert(n_obs > 0);
    assert(n_state > 0);
    
    scale = (float64 *)ckd_calloc(n_obs, sizeof(float64));
    dscale = (float64 **)ckd_calloc(n_obs, sizeof(float64 *));
    n_active_astate = (uint32 *)ckd_calloc(n_obs, sizeof(uint32));
    active_alpha  = (float64 **)ckd_calloc(n_obs, sizeof(float64 *));
    active_astate = (uint32 **)ckd_calloc(n_obs, sizeof(uint32 *));
    active_cb = ckd_calloc(2*n_state, sizeof(uint32));
    bp = (uint32 **)ckd_calloc(n_obs, sizeof(uint32 *));

    /* Run forward algorithm, which has embedded Viterbi. */
    ret = forward(active_alpha, active_astate, n_active_astate, bp,
		  scale, dscale,
		  feature, n_obs, state_seq, n_state,
		  inv, a_beam, NULL, NULL, 1);

    if (ret != S3_SUCCESS) {

	/* Some problem with the utterance, release per utterance storage and
	 * forget about adding the utterance accumulators to the global accumulators */
	
	goto all_done;
    }

    /* Find the non-emitting ending state */
    for (i = 0; i < n_active_astate[n_obs-1]; ++i) {
	if (active_astate[n_obs-1][i] == n_state-1)
	    break;
    }
    if (i == n_active_astate[n_obs-1]) {
	/* since there are so many such errors during the mmie training,
	      it's very annoying to output this error message
	      E_ERROR("Failed to align audio to trancript: final state of the search is not reached\n"); */
	ret = S3_ERROR;
	final_state_error = 1;
	goto all_done;
    }

    /* Calculate log[ p( O | \lambda ) ] */
    assert(active_alpha[n_obs-1][i] > 0);
    log_fp = log(active_alpha[n_obs-1][i]);
    for (t = 0; t < n_obs; t++) {
        assert(scale[t] > 0);
        log_fp -= log(scale[t]);
        for (j = 0; j < inv->gauden->n_feat; j++) {
            log_fp += dscale[t][j];
        }
    }
    *log_forw_prob = log_fp;

 all_done:
    ckd_free((void *)scale);
    for (i = 0; i < n_obs; i++) {
	if (dscale[i])
	    ckd_free((void *)dscale[i]);
    }
    ckd_free((void **)dscale);
    
    ckd_free(n_active_astate);
    for (i = 0; i < n_obs; i++) {
	ckd_free((void *)active_alpha[i]);
	ckd_free((void *)active_astate[i]);
	ckd_free((void *)bp[i]);
    }
    ckd_free((void *)active_alpha);
    ckd_free((void *)active_astate);
    ckd_free((void *)active_cb);
    ckd_free((void **)bp);

    if (ret != S3_SUCCESS && !final_state_error)
	E_ERROR("viterbi run error in sentence %s\n", corpus_utt_brief_name());
    
    return ret;
}